

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Index * sqlite3CreateIndex(Parse *pParse,Token *pName1,Token *pName2,SrcList *pTblName,
                          ExprList *pList,int onError,Token *pStart,Expr *pPIWhere,int sortOrder,
                          int ifNotExist)

{
  byte bVar1;
  short sVar2;
  sqlite3 *db;
  ExprList_item *pEVar3;
  long lVar4;
  Column *pCVar5;
  i16 *aiCol;
  u8 uVar6;
  u16 uVar7;
  ushort uVar8;
  int iVar9;
  uint iDb;
  int iVar10;
  uint uVar11;
  uint uVar12;
  Table *pTVar13;
  Index *pIVar14;
  Index **ppIVar15;
  Table *pTVar16;
  CollSeq *pCVar17;
  void *pvVar18;
  Vdbe *p;
  Index *pIVar19;
  Index *pIVar20;
  ulong uVar21;
  long lVar22;
  char *pcVar23;
  Db *pDVar24;
  char *pcVar25;
  Index **local_f8;
  char *local_f0;
  Index *local_d8;
  int local_c8;
  ExprList *local_c0;
  char *local_b8;
  ulong local_b0;
  ExprList_item *local_90;
  Token *local_88;
  char *local_78;
  Token *pName;
  char *local_68;
  DbFixer sFix;
  
  db = pParse->db;
  pName = (Token *)0x0;
  local_78 = (char *)0x0;
  local_c0 = pList;
  if (((db->mallocFailed == '\0') && (pParse->declareVtab == '\0')) &&
     (iVar9 = sqlite3ReadSchema(pParse), iVar9 == 0)) {
    if (pTblName == (SrcList *)0x0) {
      pTVar13 = pParse->pNewTable;
      if (pTVar13 != (Table *)0x0) {
        iDb = sqlite3SchemaToIndex(db,pTVar13->pSchema);
        local_88 = (Token *)0x0;
LAB_0013d628:
        local_d8 = (Index *)0x0;
LAB_0013d646:
        pDVar24 = db->aDb + (int)iDb;
        pcVar25 = pTVar13->zName;
        iVar9 = sqlite3_strnicmp(pcVar25,"sqlite_",7);
        if (((iVar9 == 0) && ((db->init).busy == '\0')) &&
           (iVar9 = sqlite3_strnicmp(pcVar25 + 7,"altertab_",9), iVar9 != 0)) {
          pcVar23 = "table %s may not be indexed";
LAB_0013d765:
          sqlite3ErrorMsg(pParse,pcVar23,pcVar25);
        }
        else {
          if (pTVar13->pSelect == (Select *)0x0) {
            if ((pTVar13->tabFlags & 0x10) == 0) {
              if (local_88 == (Token *)0x0) {
                for (ppIVar15 = &pTVar13->pIndex; *ppIVar15 != (Index *)0x0;
                    ppIVar15 = &(*ppIVar15)->pNext) {
                }
                pcVar25 = sqlite3MPrintf(db,"sqlite_autoindex_%s_%d",pcVar25);
                if (pcVar25 != (char *)0x0) {
LAB_0013d7ae:
                  pcVar23 = pDVar24->zName;
                  local_68 = "sqlite_master";
                  if (iDb == 1) {
                    local_68 = "sqlite_temp_master";
                  }
                  iVar9 = sqlite3AuthCheck(pParse,0x12,local_68,(char *)0x0,pcVar23);
                  pIVar14 = (Index *)0x0;
                  if (iVar9 != 0) goto LAB_0013d4ab;
                  iVar9 = sqlite3AuthCheck(pParse,(uint)(iDb == 1) * 2 + 1,pcVar25,pTVar13->zName,
                                           pcVar23);
                  if (iVar9 != 0) {
LAB_0013d81a:
                    pIVar14 = (Index *)0x0;
                    goto LAB_0013d4ab;
                  }
                  if (pList == (ExprList *)0x0) {
                    local_c0 = (ExprList *)0x0;
                    pList = sqlite3ExprListAppend(pParse,(ExprList *)0x0,(Expr *)0x0);
                    if (pList == (ExprList *)0x0) goto LAB_0013d81a;
                    pcVar23 = sqlite3DbStrDup(pParse->db,
                                              pTVar13->aCol[(long)pTVar13->nCol + -1].zName);
                    pEVar3 = pList->a;
                    pEVar3->zName = pcVar23;
                    pEVar3->sortOrder = (u8)sortOrder;
                  }
                  uVar12 = pList->nExpr;
                  lVar22 = 0;
                  uVar21 = 0;
                  if (0 < (int)uVar12) {
                    uVar21 = (ulong)uVar12;
                  }
                  iVar9 = 0;
                  for (; uVar21 << 5 != lVar22; lVar22 = lVar22 + 0x20) {
                    lVar4 = *(long *)((long)&pList->a->pExpr + lVar22);
                    if (lVar4 != 0) {
                      iVar10 = sqlite3Strlen30(*(char **)(lVar4 + 8));
                      iVar9 = iVar9 + iVar10 + 1;
                    }
                  }
                  uVar11 = sqlite3Strlen30(pcVar25);
                  uVar7 = 1;
                  if (local_d8 != (Index *)0x0) {
                    uVar7 = local_d8->nKeyCol;
                  }
                  pIVar14 = sqlite3AllocateIndexObject
                                      (db,uVar7 + (short)uVar12,uVar11 + iVar9 + 1,&local_78);
                  local_b8 = local_78;
                  local_c0 = pList;
                  if (db->mallocFailed == '\0') {
                    pIVar14->zName = local_78;
                    memcpy(local_78,pcVar25,(ulong)uVar11 + 1);
                    pIVar14->pTable = pTVar13;
                    pIVar14->onError = (u8)onError;
                    pIVar14->field_0x5b =
                         pIVar14->field_0x5b & 0xf4 |
                         (onError != 0) * '\b' + (local_88 == (Token *)0x0);
                    pIVar14->pSchema = db->aDb[(int)iDb].pSchema;
                    pIVar14->nKeyCol = (u16)pList->nExpr;
                    if (pPIWhere != (Expr *)0x0) {
                      sqlite3ResolveSelfReference(pParse,pTVar13,0x10,pPIWhere,(ExprList *)0x0);
                      pIVar14->pPartIdxWhere = pPIWhere;
                    }
                    local_b8 = local_b8 + (ulong)uVar11 + 1;
                    bVar1 = pDVar24->pSchema->file_format;
                    local_90 = pList->a;
                    for (local_b0 = 0; (long)local_b0 < (long)pList->nExpr; local_b0 = local_b0 + 1)
                    {
                      pcVar23 = local_90->zName;
                      pCVar5 = pTVar13->aCol;
                      uVar8 = pTVar13->nCol;
                      if ((short)uVar8 < 1) {
                        uVar8 = 0;
                      }
                      local_c8 = (uint)uVar8 * 0x30;
                      sVar2 = 0;
                      lVar22 = 0;
                      while( true ) {
                        if (local_c8 == (int)lVar22) {
                          pPIWhere = (Expr *)0x0;
                          sqlite3ErrorMsg(pParse,"table %s has no column named %s",pTVar13->zName,
                                          pcVar23);
                          pParse->checkSchema = '\x01';
                          goto LAB_0013dbf7;
                        }
                        iVar9 = sqlite3_stricmp(pcVar23,*(char **)((long)&pCVar5->zName + lVar22));
                        if (iVar9 == 0) break;
                        lVar22 = lVar22 + 0x30;
                        sVar2 = sVar2 + 1;
                      }
                      pIVar14->aiColumn[local_b0] = sVar2;
                      if (local_90->pExpr == (Expr *)0x0) {
                        local_f0 = local_b8;
                        local_b8 = *(char **)((long)&pCVar5->zColl + lVar22);
                        if (local_b8 == (char *)0x0) {
                          local_b8 = "BINARY";
                        }
                      }
                      else {
                        pcVar23 = (local_90->pExpr->u).zToken;
                        uVar12 = sqlite3Strlen30(pcVar23);
                        memcpy(local_b8,pcVar23,(ulong)uVar12 + 1);
                        local_f0 = local_b8 + (ulong)uVar12 + 1;
                      }
                      if (((db->init).busy == '\0') &&
                         (pCVar17 = sqlite3LocateCollSeq(pParse,local_b8), pCVar17 == (CollSeq *)0x0
                         )) goto LAB_0013df09;
                      uVar6 = '\0';
                      pIVar14->azColl[local_b0] = local_b8;
                      if (3 < bVar1) {
                        uVar6 = (u8)*(undefined4 *)&local_90->sortOrder;
                      }
                      pIVar14->aSortOrder[local_b0] = uVar6;
                      if ((&pTVar13->aCol->notNull)[lVar22] == '\0') {
                        pIVar14->field_0x5b = pIVar14->field_0x5b & 0xf7;
                      }
                      local_90 = local_90 + 1;
                      local_b8 = local_f0;
                    }
                    if (local_d8 == (Index *)0x0) {
                      pIVar14->aiColumn[local_b0 & 0xffffffff] = -1;
                      pIVar14->azColl[local_b0 & 0xffffffff] = "BINARY";
                    }
                    else {
                      for (local_f8 = (Index **)0x0; local_f8 < (ulong)local_d8->nKeyCol;
                          local_f8 = (Index **)((long)local_f8 + 1)) {
                        sVar2 = local_d8->aiColumn[(long)local_f8];
                        aiCol = pIVar14->aiColumn;
                        iVar9 = hasColumn(aiCol,(uint)pIVar14->nKeyCol,(int)sVar2);
                        if (iVar9 == 0) {
                          iVar9 = (int)local_b0;
                          aiCol[iVar9] = sVar2;
                          pIVar14->azColl[iVar9] = local_d8->azColl[(long)local_f8];
                          pIVar14->aSortOrder[iVar9] = local_d8->aSortOrder[(long)local_f8];
                          local_b0 = (ulong)(iVar9 + 1);
                        }
                        else {
                          pIVar14->nColumn = pIVar14->nColumn - 1;
                        }
                      }
                    }
                    sqlite3DefaultRowEst(pIVar14);
                    pTVar16 = pParse->pNewTable;
                    if (pTVar16 == (Table *)0x0) {
                      estimateIndexWidth(pIVar14);
                      pTVar16 = pParse->pNewTable;
                    }
                    if (pTVar13 == pTVar16) {
                      local_f8 = &pTVar13->pIndex;
                      while (pIVar20 = *local_f8, pIVar20 != (Index *)0x0) {
                        uVar8 = pIVar20->nKeyCol;
                        if (uVar8 == pIVar14->nKeyCol) {
                          uVar21 = 0;
                          while( true ) {
                            if (uVar8 == uVar21) {
                              uVar6 = pIVar20->onError;
                              if (uVar6 != pIVar14->onError) {
                                if ((uVar6 != '\n') && (pIVar14->onError != '\n')) {
                                  sqlite3ErrorMsg(pParse,"conflicting ON CONFLICT clauses specified"
                                                  ,0);
                                  uVar6 = pIVar20->onError;
                                }
                                if (uVar6 == '\n') {
                                  pIVar20->onError = pIVar14->onError;
                                  pPIWhere = (Expr *)0x0;
                                  goto LAB_0013dc03;
                                }
                              }
                              pPIWhere = (Expr *)0x0;
                              goto LAB_0013dc03;
                            }
                            if (pIVar20->aiColumn[uVar21] != pIVar14->aiColumn[uVar21]) break;
                            if ((pIVar20->azColl[uVar21] != pIVar14->azColl[uVar21]) &&
                               (iVar9 = sqlite3_stricmp(pIVar20->azColl[uVar21],
                                                        pIVar14->azColl[uVar21]), iVar9 != 0))
                            break;
                            uVar21 = uVar21 + 1;
                          }
                        }
                        local_f8 = &pIVar20->pNext;
                      }
                    }
                    if ((db->init).busy == '\0') {
                      if ((pParse->nErr == 0) &&
                         ((pTblName != (SrcList *)0x0 || ((pTVar13->tabFlags & 0x20) == 0)))) {
                        uVar12 = pParse->nMem + 1;
                        pParse->nMem = uVar12;
                        p = sqlite3GetVdbe(pParse);
                        if (p == (Vdbe *)0x0) goto LAB_0013df09;
                        sqlite3BeginWriteOperation(pParse,1,iDb);
                        sqlite3VdbeAddOp2(p,0x78,iDb,uVar12);
                        if (pStart == (Token *)0x0) {
                          pcVar23 = (char *)0x0;
                        }
                        else {
                          iVar9 = (*(int *)&(pParse->sLastToken).z - (int)local_88->z) +
                                  (pParse->sLastToken).n;
                          pcVar23 = " UNIQUE";
                          if (onError == 0) {
                            pcVar23 = "";
                          }
                          pcVar23 = sqlite3MPrintf(db,"CREATE%s INDEX %.*s",pcVar23,
                                                   (ulong)(iVar9 - (uint)(local_88->z
                                                                          [(long)iVar9 + -1] == ';')
                                                          ));
                        }
                        sqlite3NestedParse(pParse,
                                           "INSERT INTO %Q.%s VALUES(\'index\',%Q,%Q,#%d,%Q);",
                                           db->aDb[(int)iDb].zName,local_68,pIVar14->zName,
                                           pTVar13->zName,(ulong)uVar12,pcVar23);
                        sqlite3DbFree(db,pcVar23);
                        if (pTblName != (SrcList *)0x0) {
                          sqlite3RefillIndex(pParse,pIVar14,uVar12);
                          sqlite3ChangeCookie(pParse,iDb);
                          pcVar23 = sqlite3MPrintf(db,"name=\'%q\' AND type=\'index\'",
                                                   pIVar14->zName);
                          sqlite3VdbeAddParseSchemaOp(p,iDb,pcVar23);
                          sqlite3VdbeAddOp1(p,0x90,0);
                        }
                      }
LAB_0013def7:
                      if ((pTblName == (SrcList *)0x0) || ((db->init).busy != '\0')) {
                        pIVar20 = pTVar13->pIndex;
                        if (onError == 5) {
                          if (pIVar20 == (Index *)0x0) {
                            pIVar20 = (Index *)0x0;
                            goto LAB_0013df4a;
                          }
                          if (pIVar20->onError == '\x05') goto LAB_0013df4a;
                          do {
                            pIVar19 = pIVar20;
                            pIVar20 = pIVar19->pNext;
                            if (pIVar20 == (Index *)0x0) break;
                          } while (pIVar20->onError != '\x05');
                          pIVar14->pNext = pIVar20;
                          pIVar19->pNext = pIVar14;
                        }
                        else {
LAB_0013df4a:
                          pIVar14->pNext = pIVar20;
                          pTVar13->pIndex = pIVar14;
                        }
                        pPIWhere = (Expr *)0x0;
                        goto LAB_0013d4ab;
                      }
                    }
                    else {
                      pvVar18 = sqlite3HashInsert(&pIVar14->pSchema->idxHash,pIVar14->zName,pIVar14)
                      ;
                      if (pvVar18 == (void *)0x0) {
                        *(byte *)&db->flags = (byte)db->flags | 2;
                        if (pTblName != (SrcList *)0x0) {
                          pIVar14->tnum = (db->init).newTnum;
                        }
                        goto LAB_0013def7;
                      }
                      db->mallocFailed = '\x01';
                    }
LAB_0013df09:
                    pPIWhere = (Expr *)0x0;
                    pIVar20 = (Index *)0x0;
                  }
                  else {
LAB_0013dbf7:
                    pIVar20 = (Index *)0x0;
                    if (pIVar14 == (Index *)0x0) goto LAB_0013d81a;
                  }
LAB_0013dc03:
                  freeIndex(db,pIVar14);
                  pIVar14 = pIVar20;
                  goto LAB_0013d4ab;
                }
              }
              else {
                pcVar25 = sqlite3NameFromToken(db,local_88);
                if (pcVar25 != (char *)0x0) {
                  iVar9 = sqlite3CheckObjectName(pParse,pcVar25);
                  if (iVar9 == 0) {
                    if (((db->init).busy == '\0') &&
                       (pTVar16 = sqlite3FindTable(db,pcVar25,(char *)0x0), pTVar16 != (Table *)0x0)
                       ) {
                      pcVar23 = "there is already a table named %s";
                    }
                    else {
                      pIVar14 = sqlite3FindIndex(db,pcVar25,pDVar24->zName);
                      if (pIVar14 == (Index *)0x0) goto LAB_0013d7ae;
                      if (ifNotExist != 0) {
                        sqlite3CodeVerifySchema(pParse,iDb);
                        goto LAB_0013d81a;
                      }
                      pcVar23 = "index %s already exists";
                    }
                    sqlite3ErrorMsg(pParse,pcVar23,pcVar25);
                    pIVar14 = (Index *)0x0;
                    goto LAB_0013d4ab;
                  }
                  goto LAB_0013d81a;
                }
              }
              goto LAB_0013d4a8;
            }
            pcVar25 = "virtual tables may not be indexed";
          }
          else {
            pcVar25 = "views may not be indexed";
          }
          sqlite3ErrorMsg(pParse,pcVar25);
        }
      }
    }
    else {
      iDb = sqlite3TwoPartName(pParse,pName1,pName2,&pName);
      if (-1 < (int)iDb) {
        if ((((db->init).busy == '\0') &&
            (pTVar13 = sqlite3SrcListLookup(pParse,pTblName),
            pTVar13 != (Table *)0x0 && pName2->n == 0)) && (pTVar13->pSchema == db->aDb[1].pSchema))
        {
          iDb = 1;
        }
        pDVar24 = pParse->db->aDb;
        sFix.zDb = pDVar24[iDb].zName;
        sFix.pSchema = pDVar24[iDb].pSchema;
        sFix.zType = "index";
        local_88 = pName;
        sFix.pName = pName;
        sFix.bVarOnly = (int)(iDb == 1);
        sFix.pParse = pParse;
        sqlite3FixSrcList(&sFix,pTblName);
        pTVar13 = sqlite3LocateTableItem(pParse,0,pTblName->a);
        if (pTVar13 != (Table *)0x0) {
          if ((iDb != 1) || (db->aDb[1].pSchema == pTVar13->pSchema)) {
            if ((pTVar13->tabFlags & 0x20) == 0) goto LAB_0013d628;
            local_d8 = sqlite3PrimaryKeyIndex(pTVar13);
            goto LAB_0013d646;
          }
          pcVar25 = pTVar13->zName;
          pcVar23 = "cannot create a TEMP index on non-TEMP table \"%s\"";
          goto LAB_0013d765;
        }
      }
    }
  }
LAB_0013d4a8:
  pcVar25 = (char *)0x0;
  pIVar14 = (Index *)0x0;
LAB_0013d4ab:
  sqlite3ExprDelete(db,pPIWhere);
  sqlite3ExprListDelete(db,local_c0);
  sqlite3SrcListDelete(db,pTblName);
  sqlite3DbFree(db,pcVar25);
  return pIVar14;
}

Assistant:

SQLITE_PRIVATE Index *sqlite3CreateIndex(
  Parse *pParse,     /* All information about this parse */
  Token *pName1,     /* First part of index name. May be NULL */
  Token *pName2,     /* Second part of index name. May be NULL */
  SrcList *pTblName, /* Table to index. Use pParse->pNewTable if 0 */
  ExprList *pList,   /* A list of columns to be indexed */
  int onError,       /* OE_Abort, OE_Ignore, OE_Replace, or OE_None */
  Token *pStart,     /* The CREATE token that begins this statement */
  Expr *pPIWhere,    /* WHERE clause for partial indices */
  int sortOrder,     /* Sort order of primary key when pList==NULL */
  int ifNotExist     /* Omit error if index already exists */
){
  Index *pRet = 0;     /* Pointer to return */
  Table *pTab = 0;     /* Table to be indexed */
  Index *pIndex = 0;   /* The index to be created */
  char *zName = 0;     /* Name of the index */
  int nName;           /* Number of characters in zName */
  int i, j;
  DbFixer sFix;        /* For assigning database names to pTable */
  int sortOrderMask;   /* 1 to honor DESC in index.  0 to ignore. */
  sqlite3 *db = pParse->db;
  Db *pDb;             /* The specific table containing the indexed database */
  int iDb;             /* Index of the database that is being written */
  Token *pName = 0;    /* Unqualified name of the index to create */
  struct ExprList_item *pListItem; /* For looping over pList */
  const Column *pTabCol;           /* A column in the table */
  int nExtra = 0;                  /* Space allocated for zExtra[] */
  int nExtraCol;                   /* Number of extra columns needed */
  char *zExtra = 0;                /* Extra space after the Index object */
  Index *pPk = 0;      /* PRIMARY KEY index for WITHOUT ROWID tables */

  assert( pParse->nErr==0 );      /* Never called with prior errors */
  if( db->mallocFailed || IN_DECLARE_VTAB ){
    goto exit_create_index;
  }
  if( SQLITE_OK!=sqlite3ReadSchema(pParse) ){
    goto exit_create_index;
  }

  /*
  ** Find the table that is to be indexed.  Return early if not found.
  */
  if( pTblName!=0 ){

    /* Use the two-part index name to determine the database 
    ** to search for the table. 'Fix' the table name to this db
    ** before looking up the table.
    */
    assert( pName1 && pName2 );
    iDb = sqlite3TwoPartName(pParse, pName1, pName2, &pName);
    if( iDb<0 ) goto exit_create_index;
    assert( pName && pName->z );

#ifndef SQLITE_OMIT_TEMPDB
    /* If the index name was unqualified, check if the table
    ** is a temp table. If so, set the database to 1. Do not do this
    ** if initialising a database schema.
    */
    if( !db->init.busy ){
      pTab = sqlite3SrcListLookup(pParse, pTblName);
      if( pName2->n==0 && pTab && pTab->pSchema==db->aDb[1].pSchema ){
        iDb = 1;
      }
    }
#endif

    sqlite3FixInit(&sFix, pParse, iDb, "index", pName);
    if( sqlite3FixSrcList(&sFix, pTblName) ){
      /* Because the parser constructs pTblName from a single identifier,
      ** sqlite3FixSrcList can never fail. */
      assert(0);
    }
    pTab = sqlite3LocateTableItem(pParse, 0, &pTblName->a[0]);
    assert( db->mallocFailed==0 || pTab==0 );
    if( pTab==0 ) goto exit_create_index;
    if( iDb==1 && db->aDb[iDb].pSchema!=pTab->pSchema ){
      sqlite3ErrorMsg(pParse, 
           "cannot create a TEMP index on non-TEMP table \"%s\"",
           pTab->zName);
      goto exit_create_index;
    }
    if( !HasRowid(pTab) ) pPk = sqlite3PrimaryKeyIndex(pTab);
  }else{
    assert( pName==0 );
    assert( pStart==0 );
    pTab = pParse->pNewTable;
    if( !pTab ) goto exit_create_index;
    iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
  }
  pDb = &db->aDb[iDb];

  assert( pTab!=0 );
  assert( pParse->nErr==0 );
  if( sqlite3StrNICmp(pTab->zName, "sqlite_", 7)==0 
       && db->init.busy==0
#if SQLITE_USER_AUTHENTICATION
       && sqlite3UserAuthTable(pTab->zName)==0
#endif
       && sqlite3StrNICmp(&pTab->zName[7],"altertab_",9)!=0 ){
    sqlite3ErrorMsg(pParse, "table %s may not be indexed", pTab->zName);
    goto exit_create_index;
  }
#ifndef SQLITE_OMIT_VIEW
  if( pTab->pSelect ){
    sqlite3ErrorMsg(pParse, "views may not be indexed");
    goto exit_create_index;
  }
#endif
#ifndef SQLITE_OMIT_VIRTUALTABLE
  if( IsVirtual(pTab) ){
    sqlite3ErrorMsg(pParse, "virtual tables may not be indexed");
    goto exit_create_index;
  }
#endif

  /*
  ** Find the name of the index.  Make sure there is not already another
  ** index or table with the same name.  
  **
  ** Exception:  If we are reading the names of permanent indices from the
  ** sqlite_master table (because some other process changed the schema) and
  ** one of the index names collides with the name of a temporary table or
  ** index, then we will continue to process this index.
  **
  ** If pName==0 it means that we are
  ** dealing with a primary key or UNIQUE constraint.  We have to invent our
  ** own name.
  */
  if( pName ){
    zName = sqlite3NameFromToken(db, pName);
    if( zName==0 ) goto exit_create_index;
    assert( pName->z!=0 );
    if( SQLITE_OK!=sqlite3CheckObjectName(pParse, zName) ){
      goto exit_create_index;
    }
    if( !db->init.busy ){
      if( sqlite3FindTable(db, zName, 0)!=0 ){
        sqlite3ErrorMsg(pParse, "there is already a table named %s", zName);
        goto exit_create_index;
      }
    }
    if( sqlite3FindIndex(db, zName, pDb->zName)!=0 ){
      if( !ifNotExist ){
        sqlite3ErrorMsg(pParse, "index %s already exists", zName);
      }else{
        assert( !db->init.busy );
        sqlite3CodeVerifySchema(pParse, iDb);
      }
      goto exit_create_index;
    }
  }else{
    int n;
    Index *pLoop;
    for(pLoop=pTab->pIndex, n=1; pLoop; pLoop=pLoop->pNext, n++){}
    zName = sqlite3MPrintf(db, "sqlite_autoindex_%s_%d", pTab->zName, n);
    if( zName==0 ){
      goto exit_create_index;
    }
  }

  /* Check for authorization to create an index.
  */
#ifndef SQLITE_OMIT_AUTHORIZATION
  {
    const char *zDb = pDb->zName;
    if( sqlite3AuthCheck(pParse, SQLITE_INSERT, SCHEMA_TABLE(iDb), 0, zDb) ){
      goto exit_create_index;
    }
    i = SQLITE_CREATE_INDEX;
    if( !OMIT_TEMPDB && iDb==1 ) i = SQLITE_CREATE_TEMP_INDEX;
    if( sqlite3AuthCheck(pParse, i, zName, pTab->zName, zDb) ){
      goto exit_create_index;
    }
  }
#endif

  /* If pList==0, it means this routine was called to make a primary
  ** key out of the last column added to the table under construction.
  ** So create a fake list to simulate this.
  */
  if( pList==0 ){
    pList = sqlite3ExprListAppend(pParse, 0, 0);
    if( pList==0 ) goto exit_create_index;
    pList->a[0].zName = sqlite3DbStrDup(pParse->db,
                                        pTab->aCol[pTab->nCol-1].zName);
    pList->a[0].sortOrder = (u8)sortOrder;
  }

  /* Figure out how many bytes of space are required to store explicitly
  ** specified collation sequence names.
  */
  for(i=0; i<pList->nExpr; i++){
    Expr *pExpr = pList->a[i].pExpr;
    if( pExpr ){
      assert( pExpr->op==TK_COLLATE );
      nExtra += (1 + sqlite3Strlen30(pExpr->u.zToken));
    }
  }

  /* 
  ** Allocate the index structure. 
  */
  nName = sqlite3Strlen30(zName);
  nExtraCol = pPk ? pPk->nKeyCol : 1;
  pIndex = sqlite3AllocateIndexObject(db, pList->nExpr + nExtraCol,
                                      nName + nExtra + 1, &zExtra);
  if( db->mallocFailed ){
    goto exit_create_index;
  }
  assert( EIGHT_BYTE_ALIGNMENT(pIndex->aiRowLogEst) );
  assert( EIGHT_BYTE_ALIGNMENT(pIndex->azColl) );
  pIndex->zName = zExtra;
  zExtra += nName + 1;
  memcpy(pIndex->zName, zName, nName+1);
  pIndex->pTable = pTab;
  pIndex->onError = (u8)onError;
  pIndex->uniqNotNull = onError!=OE_None;
  pIndex->idxType = pName ? SQLITE_IDXTYPE_APPDEF : SQLITE_IDXTYPE_UNIQUE;
  pIndex->pSchema = db->aDb[iDb].pSchema;
  pIndex->nKeyCol = pList->nExpr;
  if( pPIWhere ){
    sqlite3ResolveSelfReference(pParse, pTab, NC_PartIdx, pPIWhere, 0);
    pIndex->pPartIdxWhere = pPIWhere;
    pPIWhere = 0;
  }
  assert( sqlite3SchemaMutexHeld(db, iDb, 0) );

  /* Check to see if we should honor DESC requests on index columns
  */
  if( pDb->pSchema->file_format>=4 ){
    sortOrderMask = -1;   /* Honor DESC */
  }else{
    sortOrderMask = 0;    /* Ignore DESC */
  }

  /* Scan the names of the columns of the table to be indexed and
  ** load the column indices into the Index structure.  Report an error
  ** if any column is not found.
  **
  ** TODO:  Add a test to make sure that the same column is not named
  ** more than once within the same index.  Only the first instance of
  ** the column will ever be used by the optimizer.  Note that using the
  ** same column more than once cannot be an error because that would 
  ** break backwards compatibility - it needs to be a warning.
  */
  for(i=0, pListItem=pList->a; i<pList->nExpr; i++, pListItem++){
    const char *zColName = pListItem->zName;
    int requestedSortOrder;
    char *zColl;                   /* Collation sequence name */

    for(j=0, pTabCol=pTab->aCol; j<pTab->nCol; j++, pTabCol++){
      if( sqlite3StrICmp(zColName, pTabCol->zName)==0 ) break;
    }
    if( j>=pTab->nCol ){
      sqlite3ErrorMsg(pParse, "table %s has no column named %s",
        pTab->zName, zColName);
      pParse->checkSchema = 1;
      goto exit_create_index;
    }
    assert( j<=0x7fff );
    pIndex->aiColumn[i] = (i16)j;
    if( pListItem->pExpr ){
      int nColl;
      assert( pListItem->pExpr->op==TK_COLLATE );
      zColl = pListItem->pExpr->u.zToken;
      nColl = sqlite3Strlen30(zColl) + 1;
      assert( nExtra>=nColl );
      memcpy(zExtra, zColl, nColl);
      zColl = zExtra;
      zExtra += nColl;
      nExtra -= nColl;
    }else{
      zColl = pTab->aCol[j].zColl;
      if( !zColl ) zColl = "BINARY";
    }
    if( !db->init.busy && !sqlite3LocateCollSeq(pParse, zColl) ){
      goto exit_create_index;
    }
    pIndex->azColl[i] = zColl;
    requestedSortOrder = pListItem->sortOrder & sortOrderMask;
    pIndex->aSortOrder[i] = (u8)requestedSortOrder;
    if( pTab->aCol[j].notNull==0 ) pIndex->uniqNotNull = 0;
  }
  if( pPk ){
    for(j=0; j<pPk->nKeyCol; j++){
      int x = pPk->aiColumn[j];
      if( hasColumn(pIndex->aiColumn, pIndex->nKeyCol, x) ){
        pIndex->nColumn--; 
      }else{
        pIndex->aiColumn[i] = x;
        pIndex->azColl[i] = pPk->azColl[j];
        pIndex->aSortOrder[i] = pPk->aSortOrder[j];
        i++;
      }
    }
    assert( i==pIndex->nColumn );
  }else{
    pIndex->aiColumn[i] = -1;
    pIndex->azColl[i] = "BINARY";
  }
  sqlite3DefaultRowEst(pIndex);
  if( pParse->pNewTable==0 ) estimateIndexWidth(pIndex);

  if( pTab==pParse->pNewTable ){
    /* This routine has been called to create an automatic index as a
    ** result of a PRIMARY KEY or UNIQUE clause on a column definition, or
    ** a PRIMARY KEY or UNIQUE clause following the column definitions.
    ** i.e. one of:
    **
    ** CREATE TABLE t(x PRIMARY KEY, y);
    ** CREATE TABLE t(x, y, UNIQUE(x, y));
    **
    ** Either way, check to see if the table already has such an index. If
    ** so, don't bother creating this one. This only applies to
    ** automatically created indices. Users can do as they wish with
    ** explicit indices.
    **
    ** Two UNIQUE or PRIMARY KEY constraints are considered equivalent
    ** (and thus suppressing the second one) even if they have different
    ** sort orders.
    **
    ** If there are different collating sequences or if the columns of
    ** the constraint occur in different orders, then the constraints are
    ** considered distinct and both result in separate indices.
    */
    Index *pIdx;
    for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
      int k;
      assert( IsUniqueIndex(pIdx) );
      assert( pIdx->idxType!=SQLITE_IDXTYPE_APPDEF );
      assert( IsUniqueIndex(pIndex) );

      if( pIdx->nKeyCol!=pIndex->nKeyCol ) continue;
      for(k=0; k<pIdx->nKeyCol; k++){
        const char *z1;
        const char *z2;
        if( pIdx->aiColumn[k]!=pIndex->aiColumn[k] ) break;
        z1 = pIdx->azColl[k];
        z2 = pIndex->azColl[k];
        if( z1!=z2 && sqlite3StrICmp(z1, z2) ) break;
      }
      if( k==pIdx->nKeyCol ){
        if( pIdx->onError!=pIndex->onError ){
          /* This constraint creates the same index as a previous
          ** constraint specified somewhere in the CREATE TABLE statement.
          ** However the ON CONFLICT clauses are different. If both this 
          ** constraint and the previous equivalent constraint have explicit
          ** ON CONFLICT clauses this is an error. Otherwise, use the
          ** explicitly specified behavior for the index.
          */
          if( !(pIdx->onError==OE_Default || pIndex->onError==OE_Default) ){
            sqlite3ErrorMsg(pParse, 
                "conflicting ON CONFLICT clauses specified", 0);
          }
          if( pIdx->onError==OE_Default ){
            pIdx->onError = pIndex->onError;
          }
        }
        pRet = pIdx;
        goto exit_create_index;
      }
    }
  }

  /* Link the new Index structure to its table and to the other
  ** in-memory database structures. 
  */
  if( db->init.busy ){
    Index *p;
    assert( sqlite3SchemaMutexHeld(db, 0, pIndex->pSchema) );
    p = sqlite3HashInsert(&pIndex->pSchema->idxHash, 
                          pIndex->zName, pIndex);
    if( p ){
      assert( p==pIndex );  /* Malloc must have failed */
      db->mallocFailed = 1;
      goto exit_create_index;
    }
    db->flags |= SQLITE_InternChanges;
    if( pTblName!=0 ){
      pIndex->tnum = db->init.newTnum;
    }
  }

  /* If this is the initial CREATE INDEX statement (or CREATE TABLE if the
  ** index is an implied index for a UNIQUE or PRIMARY KEY constraint) then
  ** emit code to allocate the index rootpage on disk and make an entry for
  ** the index in the sqlite_master table and populate the index with
  ** content.  But, do not do this if we are simply reading the sqlite_master
  ** table to parse the schema, or if this index is the PRIMARY KEY index
  ** of a WITHOUT ROWID table.
  **
  ** If pTblName==0 it means this index is generated as an implied PRIMARY KEY
  ** or UNIQUE index in a CREATE TABLE statement.  Since the table
  ** has just been created, it contains no data and the index initialization
  ** step can be skipped.
  */
  else if( pParse->nErr==0 && (HasRowid(pTab) || pTblName!=0) ){
    Vdbe *v;
    char *zStmt;
    int iMem = ++pParse->nMem;

    v = sqlite3GetVdbe(pParse);
    if( v==0 ) goto exit_create_index;


    /* Create the rootpage for the index
    */
    sqlite3BeginWriteOperation(pParse, 1, iDb);
    sqlite3VdbeAddOp2(v, OP_CreateIndex, iDb, iMem);

    /* Gather the complete text of the CREATE INDEX statement into
    ** the zStmt variable
    */
    if( pStart ){
      int n = (int)(pParse->sLastToken.z - pName->z) + pParse->sLastToken.n;
      if( pName->z[n-1]==';' ) n--;
      /* A named index with an explicit CREATE INDEX statement */
      zStmt = sqlite3MPrintf(db, "CREATE%s INDEX %.*s",
        onError==OE_None ? "" : " UNIQUE", n, pName->z);
    }else{
      /* An automatic index created by a PRIMARY KEY or UNIQUE constraint */
      /* zStmt = sqlite3MPrintf(""); */
      zStmt = 0;
    }

    /* Add an entry in sqlite_master for this index
    */
    sqlite3NestedParse(pParse, 
        "INSERT INTO %Q.%s VALUES('index',%Q,%Q,#%d,%Q);",
        db->aDb[iDb].zName, SCHEMA_TABLE(iDb),
        pIndex->zName,
        pTab->zName,
        iMem,
        zStmt
    );
    sqlite3DbFree(db, zStmt);

    /* Fill the index with data and reparse the schema. Code an OP_Expire
    ** to invalidate all pre-compiled statements.
    */
    if( pTblName ){
      sqlite3RefillIndex(pParse, pIndex, iMem);
      sqlite3ChangeCookie(pParse, iDb);
      sqlite3VdbeAddParseSchemaOp(v, iDb,
         sqlite3MPrintf(db, "name='%q' AND type='index'", pIndex->zName));
      sqlite3VdbeAddOp1(v, OP_Expire, 0);
    }
  }

  /* When adding an index to the list of indices for a table, make
  ** sure all indices labeled OE_Replace come after all those labeled
  ** OE_Ignore.  This is necessary for the correct constraint check
  ** processing (in sqlite3GenerateConstraintChecks()) as part of
  ** UPDATE and INSERT statements.  
  */
  if( db->init.busy || pTblName==0 ){
    if( onError!=OE_Replace || pTab->pIndex==0
         || pTab->pIndex->onError==OE_Replace){
      pIndex->pNext = pTab->pIndex;
      pTab->pIndex = pIndex;
    }else{
      Index *pOther = pTab->pIndex;
      while( pOther->pNext && pOther->pNext->onError!=OE_Replace ){
        pOther = pOther->pNext;
      }
      pIndex->pNext = pOther->pNext;
      pOther->pNext = pIndex;
    }
    pRet = pIndex;
    pIndex = 0;
  }

  /* Clean up before exiting */
exit_create_index:
  if( pIndex ) freeIndex(db, pIndex);
  sqlite3ExprDelete(db, pPIWhere);
  sqlite3ExprListDelete(db, pList);
  sqlite3SrcListDelete(db, pTblName);
  sqlite3DbFree(db, zName);
  return pRet;
}